

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3BtreeIndexMoveto(BtCursor *pCur,UnpackedRecord *pIdxKey,int *pRes)

{
  u16 *puVar1;
  uchar *puVar2;
  MemPage **ppMVar3;
  byte bVar4;
  KeyInfo *pKVar5;
  anon_union_8_2_94730112_for_u *paVar6;
  u8 *puVar7;
  ushort uVar8;
  int iVar9;
  u32 uVar10;
  byte *pbVar11;
  uchar *pBuf;
  char cVar12;
  long lVar13;
  ulong uVar14;
  u16 uVar15;
  int iVar16;
  int iVar17;
  MemPage *pPage;
  i8 iVar18;
  i8 iVar19;
  uint uVar20;
  int iVar21;
  code *xRecordCompare;
  
  pKVar5 = pIdxKey->pKeyInfo;
  xRecordCompare = sqlite3VdbeRecordCompare;
  if (pKVar5->nAllField < 0xe) {
    paVar6 = (anon_union_8_2_94730112_for_u *)pIdxKey->aMem;
    uVar8 = *(u16 *)((long)paVar6 + 0x14);
    if (*pKVar5->aSortFlags == 0) {
      iVar18 = '\x01';
      iVar19 = -1;
    }
    else {
      if ((*pKVar5->aSortFlags & 2) != 0) goto LAB_0013f0bc;
      iVar18 = -1;
      iVar19 = '\x01';
    }
    pIdxKey->r1 = iVar19;
    pIdxKey->r2 = iVar18;
    if ((uVar8 & 4) == 0) {
      if (((uVar8 & 0x39) == 0) && (pKVar5->aColl[0] == (CollSeq *)0x0)) {
        pIdxKey->u = paVar6[1];
        pIdxKey->n = *(int *)(paVar6 + 2);
        xRecordCompare = vdbeRecordCompareString;
      }
    }
    else {
      pIdxKey->u = *paVar6;
      xRecordCompare = vdbeRecordCompareInt;
    }
  }
LAB_0013f0bc:
  pIdxKey->errCode = '\0';
  if ((pCur->eState == '\0') && (pCur->pPage->leaf != '\0')) {
    bVar4 = pCur->iPage;
    uVar14 = 0;
    if ((char)bVar4 < '\x01') {
      bVar4 = 0;
    }
    do {
      if (bVar4 == uVar14) {
        if (((pCur->pPage->nCell - 1 == (uint)pCur->ix) &&
            (iVar9 = indexCellCompare(pCur,(uint)pCur->ix,pIdxKey,xRecordCompare), iVar9 < 1)) &&
           (pIdxKey->errCode == '\0')) {
          *pRes = iVar9;
          goto LAB_0013f3b3;
        }
        if ((('\0' < pCur->iPage) &&
            (iVar9 = indexCellCompare(pCur,0,pIdxKey,xRecordCompare), iVar9 < 1)) &&
           (pIdxKey->errCode == '\0')) {
          pCur->curFlags = pCur->curFlags & 0xfb;
          pPage = pCur->pPage;
          if (pPage->isInit != '\0') goto LAB_0013f0f0;
          iVar9 = 0x12af9;
          goto LAB_0013f49d;
        }
        pIdxKey->errCode = '\0';
        break;
      }
      ppMVar3 = pCur->apPage + uVar14;
      puVar1 = pCur->aiIdx + uVar14;
      uVar14 = uVar14 + 1;
    } while ((*ppMVar3)->nCell <= *puVar1);
  }
  iVar9 = moveToRoot(pCur);
  if (iVar9 == 0x10) {
    *pRes = -1;
LAB_0013f3b3:
    iVar9 = 0;
  }
  else if (iVar9 == 0) {
    pPage = pCur->pPage;
LAB_0013f0f0:
    uVar8 = pPage->nCell;
LAB_0013f10e:
    iVar16 = uVar8 - 1;
    iVar21 = 0;
    iVar9 = iVar16;
    do {
      puVar7 = pPage->aDataOfst;
      iVar17 = iVar16 >> 1;
      uVar14 = (ulong)(CONCAT11(pPage->aCellIdx[(long)iVar16 & 0xfffffffffffffffeU],
                                pPage->aCellIdx[((long)iVar16 & 0xfffffffffffffffeU) + 1]) &
                      pPage->maskPage);
      pbVar11 = puVar7 + uVar14 + 1;
      bVar4 = puVar7[uVar14];
      uVar20 = (uint)bVar4;
      uVar15 = (u16)iVar17;
      if (pPage->max1bytePayload < bVar4) {
        if ((-1 < (char)*pbVar11) &&
           (uVar20 = (bVar4 & 0x7f) << 7 | (int)(char)*pbVar11, uVar20 <= pPage->maxLocal)) {
          pbVar11 = puVar7 + uVar14 + 2;
          goto LAB_0013f245;
        }
        (*pPage->xParseCell)(pPage,puVar7 + (uVar14 - pPage->childPtrSize),&pCur->info);
        uVar14 = (pCur->info).nKey;
        uVar10 = (u32)uVar14;
        if (((int)uVar10 < 2) ||
           (pCur->pBt->nPage < (uint)((uVar14 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
          iVar9 = 0x12b50;
LAB_0013f431:
          iVar16 = sqlite3CorruptError(iVar9);
        }
        else {
          pBuf = (uchar *)sqlite3Malloc((ulong)(uVar10 + 0x12));
          if (pBuf == (uchar *)0x0) {
            iVar16 = 7;
          }
          else {
            pCur->ix = uVar15;
            iVar16 = accessPayload(pCur,0,uVar10,pBuf,0);
            puVar2 = pBuf + (uVar10 & 0x7fffffff);
            puVar2[0] = '\0';
            puVar2[1] = '\0';
            puVar2[2] = '\0';
            puVar2[3] = '\0';
            puVar2[4] = '\0';
            puVar2[5] = '\0';
            puVar2[6] = '\0';
            puVar2[7] = '\0';
            puVar2[8] = '\0';
            puVar2[9] = '\0';
            puVar2[10] = '\0';
            puVar2[0xb] = '\0';
            puVar2[0xc] = '\0';
            puVar2[0xd] = '\0';
            puVar2[0xe] = '\0';
            puVar2[0xf] = '\0';
            (pBuf + (ulong)(uVar10 & 0x7fffffff) + 0x10)[0] = '\0';
            (pBuf + (ulong)(uVar10 & 0x7fffffff) + 0x10)[1] = '\0';
            pCur->curFlags = pCur->curFlags & 0xfb;
            if (iVar16 == 0) {
              iVar16 = sqlite3VdbeRecordCompare(uVar10,pBuf,pIdxKey);
              sqlite3_free(pBuf);
              goto LAB_0013f24e;
            }
            sqlite3_free(pBuf);
          }
        }
        goto LAB_0013f483;
      }
LAB_0013f245:
      iVar16 = (*xRecordCompare)(uVar20,pbVar11,pIdxKey);
LAB_0013f24e:
      if (iVar16 < 0) {
        iVar21 = iVar17 + 1;
      }
      else {
        if (iVar16 == 0) {
          *pRes = 0;
          pCur->ix = uVar15;
          if (pIdxKey->errCode != '\0') {
            iVar9 = 0x12b70;
            goto LAB_0013f431;
          }
          goto LAB_0013f481;
        }
        iVar9 = iVar17 + -1;
      }
      if (iVar9 < iVar21) goto LAB_0013f27f;
      iVar16 = iVar21 + iVar9;
    } while( true );
  }
  return iVar9;
LAB_0013f27f:
  if (pPage->leaf != '\0') {
    pCur->ix = uVar15;
    *pRes = iVar16;
LAB_0013f481:
    iVar16 = 0;
    goto LAB_0013f483;
  }
  if (iVar21 < (int)(uint)pPage->nCell) {
    uVar14 = (ulong)(CONCAT11(pPage->aCellIdx[(long)iVar21 * 2],
                              pPage->aCellIdx[(long)iVar21 * 2 + 1]) & pPage->maskPage);
  }
  else {
    uVar14 = (ulong)pPage->hdrOffset + 8;
  }
  uVar10 = sqlite3Get4byte(pPage->aData + uVar14);
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  cVar12 = pCur->iPage;
  lVar13 = (long)cVar12;
  if (0x12 < lVar13) {
    iVar9 = 0x12b8f;
LAB_0013f49d:
    iVar9 = sqlite3CorruptError(iVar9);
    return iVar9;
  }
  pCur->aiIdx[lVar13] = (u16)iVar21;
  pCur->apPage[lVar13] = pCur->pPage;
  pCur->ix = 0;
  pCur->iPage = cVar12 + '\x01';
  iVar16 = getAndInitPage(pCur->pBt,uVar10,&pCur->pPage,(uint)pCur->curPagerFlags);
  if (iVar16 != 0) goto LAB_0013f34e;
  pPage = pCur->pPage;
  uVar8 = pPage->nCell;
  if ((uVar8 == 0) || (pPage->intKey != pCur->curIntKey)) {
    releasePage(pPage);
    iVar16 = sqlite3CorruptError(0x12b9a);
LAB_0013f34e:
    cVar12 = pCur->iPage + -1;
    pCur->iPage = cVar12;
    pCur->pPage = pCur->apPage[cVar12];
LAB_0013f483:
    (pCur->info).nSize = 0;
    return iVar16;
  }
  goto LAB_0013f10e;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIndexMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo!=0 );

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
  pIdxKey->errCode = 0;
  assert( pIdxKey->default_rc==1
       || pIdxKey->default_rc==0
       || pIdxKey->default_rc==-1
  );


  /* Check to see if we can skip a lot of work.  Two cases:
  **
  **    (1) If the cursor is already pointing to the very last cell
  **        in the table and the pIdxKey search key is greater than or
  **        equal to that last cell, then no movement is required.
  **
  **    (2) If the cursor is on the last page of the table and the first
  **        cell on that last page is less than or equal to the pIdxKey
  **        search key, then we can start the search on the current page
  **        without needing to go back to root.
  */
  if( pCur->eState==CURSOR_VALID
   && pCur->pPage->leaf
   && cursorOnLastPage(pCur)
  ){
    int c;
    if( pCur->ix==pCur->pPage->nCell-1
     && (c = indexCellCompare(pCur, pCur->ix, pIdxKey, xRecordCompare))<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      *pRes = c;
      return SQLITE_OK;  /* Cursor already pointing at the correct spot */
    }
    if( pCur->iPage>0
     && indexCellCompare(pCur, 0, pIdxKey, xRecordCompare)<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      pCur->curFlags &= ~BTCF_ValidOvfl;
      if( !pCur->pPage->isInit ){
        return SQLITE_CORRUPT_BKPT;
      }
      goto bypass_moveto_root;  /* Start search on the current page */
    }
    pIdxKey->errCode = SQLITE_OK;
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }

bypass_moveto_root:
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->curIntKey==0 );
  assert( pIdxKey!=0 );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==0 );
    lwr = 0;
    upr = pPage->nCell-1;
    idx = upr>>1; /* idx = (lwr+upr)/2; */
    for(;;){
      int nCell;  /* Size of the pCell cell in bytes */
      pCell = findCellPastPtr(pPage, idx);

      /* The maximum supported page-size is 65536 bytes. This means that
      ** the maximum number of record bytes stored on an index B-Tree
      ** page is less than 16384 bytes and may be stored as a 2-byte
      ** varint. This information is used to attempt to avoid parsing
      ** the entire cell by checking for the cases where the record is
      ** stored entirely within the b-tree page by inspecting the first
      ** 2 bytes of the cell.
      */
      nCell = pCell[0];
      if( nCell<=pPage->max1bytePayload ){
        /* This branch runs if the record-size field of the cell is a
        ** single byte varint and the record fits entirely on the main
        ** b-tree page.  */
        testcase( pCell+nCell+1==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
      }else if( !(pCell[1] & 0x80)
        && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
      ){
        /* The record-size field is a 2 byte varint and the record
        ** fits entirely on the main b-tree page.  */
        testcase( pCell+nCell+2==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
      }else{
        /* The record flows over onto one or more overflow pages. In
        ** this case the whole cell needs to be parsed, a buffer allocated
        ** and accessPayload() used to retrieve the record into the
        ** buffer before VdbeRecordCompare() can be called.
        **
        ** If the record is corrupt, the xRecordCompare routine may read
        ** up to two varints past the end of the buffer. An extra 18
        ** bytes of padding is allocated at the end of the buffer in
        ** case this happens.  */
        void *pCellKey;
        u8 * const pCellBody = pCell - pPage->childPtrSize;
        const int nOverrun = 18;  /* Size of the overrun padding */
        pPage->xParseCell(pPage, pCellBody, &pCur->info);
        nCell = (int)pCur->info.nKey;
        testcase( nCell<0 );   /* True if key size is 2^32 or more */
        testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
        testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
        testcase( nCell==2 );  /* Minimum legal index key size */
        if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
          rc = SQLITE_CORRUPT_PAGE(pPage);
          goto moveto_index_finish;
        }
        pCellKey = sqlite3Malloc( nCell+nOverrun );
        if( pCellKey==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto moveto_index_finish;
        }
        pCur->ix = (u16)idx;
        rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
        memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
        pCur->curFlags &= ~BTCF_ValidOvfl;
        if( rc ){
          sqlite3_free(pCellKey);
          goto moveto_index_finish;
        }
        c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
        sqlite3_free(pCellKey);
      }
      assert(
          (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
       && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
      );
      if( c<0 ){
        lwr = idx+1;
      }else if( c>0 ){
        upr = idx-1;
      }else{
        assert( c==0 );
        *pRes = 0;
        rc = SQLITE_OK;
        pCur->ix = (u16)idx;
        if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
        goto moveto_index_finish;
      }
      if( lwr>upr ) break;
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell || CORRUPT_DB );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_index_finish;
    }
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }

    /* This block is similar to an in-lined version of:
    **
    **    pCur->ix = (u16)lwr;
    **    rc = moveToChild(pCur, chldPg);
    **    if( rc ) break;
    */
    pCur->info.nSize = 0;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    if( pCur->iPage>=(BTCURSOR_MAX_DEPTH-1) ){
      return SQLITE_CORRUPT_BKPT;
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    pCur->apPage[pCur->iPage] = pCur->pPage;
    pCur->ix = 0;
    pCur->iPage++;
    rc = getAndInitPage(pCur->pBt, chldPg, &pCur->pPage, pCur->curPagerFlags);
    if( rc==SQLITE_OK
     && (pCur->pPage->nCell<1 || pCur->pPage->intKey!=pCur->curIntKey)
    ){
      releasePage(pCur->pPage);
      rc = SQLITE_CORRUPT_PGNO(chldPg);
    }
    if( rc ){
      pCur->pPage = pCur->apPage[--pCur->iPage];
      break;
    }
    /*
    ***** End of in-lined moveToChild() call */
 }
moveto_index_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}